

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string local_1518;
  TPZGeoBlend<pzgeom::TPZGeoTetrahedra> local_14f8;
  
  local_1518._M_dataplus._M_p = (pointer)&local_1518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1518,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_1518);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TPZGeoBlend(&local_14f8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::ClassId(&local_14f8);
  local_14f8.super_TPZGeoTetrahedra.super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.
  super_TPZTetrahedron.super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZGeoBlend_018b6510;
  lVar4 = 0x1330;
  do {
    TPZTransform<double>::~TPZTransform
              ((TPZTransform<double> *)
               ((long)local_14f8.super_TPZGeoTetrahedra.
                      super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + -0x1a0;
  } while (lVar4 != -0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1518._M_dataplus._M_p != &local_1518.field_2) {
    operator_delete(local_1518._M_dataplus._M_p,local_1518.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}